

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O3

string * __thiscall Json::Value::asString_abi_cxx11_(string *__return_storage_ptr__,Value *this)

{
  bool bVar1;
  size_t sVar2;
  int in_EDX;
  char *pcVar3;
  char *__s;
  
  switch(this->field_0x8) {
  case 0:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "";
    __s = "";
    break;
  case 1:
    beast::lexicalCastThrow<std::__cxx11::string,int>
              (__return_storage_ptr__,(beast *)(ulong)(this->value_).uint_,in_EDX);
    return __return_storage_ptr__;
  case 2:
  case 3:
  case 6:
  case 7:
    jbcoin::Throw<std::runtime_error,char_const(&)[34]>
              ((char (*) [34])"Type is not convertible to string");
  case 4:
    __s = "";
    if ((this->value_).string_ != (char *)0x0) {
      __s = (this->value_).string_;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    sVar2 = strlen(__s);
    pcVar3 = __s + sVar2;
    break;
  case 5:
    bVar1 = (this->value_).bool_;
    __s = "false";
    if ((ulong)bVar1 != 0) {
      __s = "true";
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = __s + ((ulong)bVar1 ^ 5);
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/extras/jbcoin-libpp/extras/jbcoind/src/jbcoin/json/impl/json_value.cpp"
                  ,0x217,"std::string Json::Value::asString() const");
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,__s,pcVar3);
  return __return_storage_ptr__;
}

Assistant:

std::string
Value::asString () const
{
    switch ( type_ )
    {
    case nullValue:
        return "";

    case stringValue:
        return value_.string_ ? value_.string_ : "";

    case booleanValue:
        return value_.bool_ ? "true" : "false";

    case intValue:
        return beast::lexicalCastThrow <std::string> (value_.int_);

    case uintValue:
    case realValue:
    case arrayValue:
    case objectValue:
        JSON_ASSERT_MESSAGE ( false, "Type is not convertible to string" );

    default:
        JSON_ASSERT_UNREACHABLE;
    }

    return ""; // unreachable
}